

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlACatalogResolve(xmlCatalogPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  char *pcVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  
  pxVar3 = (xmlChar *)0x0;
  if ((catal != (xmlCatalogPtr)0x0) && (pubID != (xmlChar *)0x0 || sysID != (xmlChar *)0x0)) {
    if (xmlDebugCatalogs != 0) {
      if (sysID == (xmlChar *)0x0 || pubID == (xmlChar *)0x0) {
        if (pubID == (xmlChar *)0x0) {
          pcVar1 = "Local Resolve: sysID %s\n";
          pxVar3 = sysID;
        }
        else {
          pcVar1 = "Local Resolve: pubID %s\n";
          pxVar3 = pubID;
        }
        xmlCatalogPrintDebug(pcVar1 + 6,pxVar3);
      }
      else {
        xmlCatalogPrintDebug("Resolve: pubID %s sysID %s\n",pubID,sysID);
      }
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar2 = xmlCatalogListXMLResolve(catal->xml,pubID,sysID);
      pxVar3 = (xmlChar *)0x0;
      if (pxVar2 != (xmlChar *)0xffffffffffffffff) {
        pxVar3 = pxVar2;
      }
    }
    else {
      pxVar3 = xmlCatalogSGMLResolve(catal,pubID,sysID);
      if (pxVar3 != (xmlChar *)0x0) {
        pxVar3 = xmlStrdup(pxVar3);
        return pxVar3;
      }
      pxVar3 = (xmlChar *)0x0;
    }
  }
  return pxVar3;
}

Assistant:

xmlChar *
xmlACatalogResolve(xmlCatalogPtr catal, const xmlChar * pubID,
                   const xmlChar * sysID)
{
    xmlChar *ret = NULL;

    if (((pubID == NULL) && (sysID == NULL)) || (catal == NULL))
        return (NULL);

    if (xmlDebugCatalogs) {
         if ((pubID != NULL) && (sysID != NULL)) {
             xmlCatalogPrintDebug(
                             "Resolve: pubID %s sysID %s\n", pubID, sysID);
         } else if (pubID != NULL) {
             xmlCatalogPrintDebug(
                             "Resolve: pubID %s\n", pubID);
         } else {
             xmlCatalogPrintDebug(
                             "Resolve: sysID %s\n", sysID);
         }
    }

    if (catal->type == XML_XML_CATALOG_TYPE) {
        ret = xmlCatalogListXMLResolve(catal->xml, pubID, sysID);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
        const xmlChar *sgml;

        sgml = xmlCatalogSGMLResolve(catal, pubID, sysID);
        if (sgml != NULL)
            ret = xmlStrdup(sgml);
    }
    return (ret);
}